

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O2

void Saig_ManAnalizeControl(Aig_Man_t *p,int Reg)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObj_00;
  int iVar2;
  
  pAVar1 = Saig_ManLo(p,Reg);
  pObj = Saig_ManLo(p,p->nRegs + -1);
  if (pObj->Id <= pAVar1->Id) {
    __assert_fail("pReg->Id < pCtrl->Id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigPhase.c"
                  ,0x26a,"void Saig_ManAnalizeControl(Aig_Man_t *, int)");
  }
  iVar2 = 0;
  while( true ) {
    if (p->vObjs->nSize <= iVar2) {
      puts("Register is not found.");
      return;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar2);
    if ((((pObj_00 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj_00->field_0x18 & 7) - 7))
        && (pAVar1 == (Aig_Obj_t *)((ulong)pObj_00->pFanin0 & 0xfffffffffffffffe))) &&
       (pObj == (Aig_Obj_t *)((ulong)pObj_00->pFanin1 & 0xfffffffffffffffe))) break;
    iVar2 = iVar2 + 1;
  }
  puts("Clock-like register: ");
  Aig_ObjPrint(p,pAVar1);
  putchar(10);
  puts("Control register: ");
  Aig_ObjPrint(p,pObj);
  putchar(10);
  puts("Their fanout: ");
  Aig_ObjPrint(p,pObj_00);
  putchar(10);
  puts("Fanouts of the fanout: ");
  for (iVar2 = 0; iVar2 < p->vObjs->nSize; iVar2 = iVar2 + 1) {
    pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar2);
    if ((pAVar1 != (Aig_Obj_t *)0x0) &&
       ((pObj_00 == (Aig_Obj_t *)((ulong)pAVar1->pFanin0 & 0xfffffffffffffffe) ||
        (pObj_00 == (Aig_Obj_t *)((ulong)pAVar1->pFanin1 & 0xfffffffffffffffe))))) {
      Aig_ObjPrint(p,pAVar1);
      putchar(10);
    }
  }
  putchar(10);
  return;
}

Assistant:

void Saig_ManAnalizeControl( Aig_Man_t * p, int Reg )
{
    Aig_Obj_t * pObj, * pReg, * pCtrl, * pAnd;
    int i;
    pReg = Saig_ManLo( p, Reg );
    pCtrl = Saig_ManLo( p, Saig_ManRegNum(p)-1 );
    assert( pReg->Id < pCtrl->Id );
    // find a node pointing to both
    pAnd = NULL;
    Aig_ManForEachNode( p, pObj, i )
    {
        if ( Aig_ObjFanin0(pObj) == pReg && Aig_ObjFanin1(pObj) == pCtrl )
        {
            pAnd = pObj;
            break;
        }
    }
    if ( pAnd == NULL )
    {
        printf( "Register is not found.\n" );
        return;
    }
    printf( "Clock-like register: \n" );
    Aig_ObjPrint( p, pReg );
    printf( "\n" );
    printf( "Control register: \n" );
    Aig_ObjPrint( p, pCtrl );
    printf( "\n" );
    printf( "Their fanout: \n" );
    Aig_ObjPrint( p, pAnd );
    printf( "\n" );
 
    // find the fanouts of pAnd
    printf( "Fanouts of the fanout: \n" );
    Aig_ManForEachObj( p, pObj, i )
        if ( Aig_ObjFanin0(pObj) == pAnd || Aig_ObjFanin1(pObj) == pAnd )
        {
            Aig_ObjPrint( p, pObj );
            printf( "\n" );
        }
    printf( "\n" );
}